

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

int pbrt::Log2Int(double v)

{
  uint64_t uVar1;
  double in_XMM0_Qa;
  uint64_t midsignif;
  double in_stack_ffffffffffffffe8;
  int local_4;
  
  if (1.0 <= in_XMM0_Qa) {
    local_4 = Exponent(3.10827517836372e-317);
    uVar1 = Significand(3.10828258934841e-317);
    local_4 = local_4 + (uint)(0x6a09e667f3bcc < uVar1);
  }
  else {
    local_4 = Log2Int(in_stack_ffffffffffffffe8);
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
inline int Log2Int(double v) {
    DCHECK_GT(v, 0);
    if (v < 1)
        return -Log2Int(1 / v);
    // https://graphics.stanford.edu/~seander/bithacks.html#IntegerLog
    // (With an additional check of the significant to get round-to-nearest
    // rather than round down.)
    // midsignif = Significand(std::pow(2., 1.5))
    // i.e. grab the significand of a value halfway between two exponents,
    // in log space.
    const uint64_t midsignif = 0b110101000001001111001100110011111110011101111001101;
    return Exponent(v) + ((Significand(v) >= midsignif) ? 1 : 0);
}